

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_stream_file.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  ALLEGRO_EVENT event;
  int local_78 [18];
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    pcVar9 = "Could not init Allegro.\n";
  }
  else {
    if (argc < 2) {
      log_printf("This example needs to be run from the command line.\n");
      log_printf("Usage: %s [--loop] {audio_files}\n",*argv);
      return 0;
    }
    iVar2 = strcmp(argv[1],"--loop");
    uVar8 = (iVar2 == 0) + 1;
    al_init_acodec_addon();
    cVar1 = al_install_audio();
    if (cVar1 == '\0') {
      pcVar9 = "Could not init sound!\n";
    }
    else {
      lVar3 = al_create_voice(0xac44,1,0x20);
      if (lVar3 == 0) {
        pcVar9 = "Could not create ALLEGRO_VOICE.\n";
      }
      else {
        log_printf("Voice created.\n");
        lVar4 = al_create_mixer(0xac44,3,0x20);
        if (lVar4 == 0) {
          pcVar9 = "Could not create ALLEGRO_MIXER.\n";
        }
        else {
          log_printf("Mixer created.\n");
          cVar1 = al_attach_mixer_to_voice(lVar4,lVar3);
          if (cVar1 != '\0') {
            if (uVar8 < (uint)argc) {
              uVar10 = (ulong)uVar8;
              do {
                pcVar9 = argv[uVar10];
                uVar5 = al_create_event_queue();
                lVar6 = al_load_audio_stream(pcVar9,4,0x800);
                if (lVar6 == 0) {
                  log_printf("Could not create an ALLEGRO_AUDIO_STREAM from \'%s\'!\n",pcVar9);
                }
                else {
                  log_printf("Stream created from \'%s\'.\n",pcVar9);
                  if (iVar2 == 0) {
                    al_set_audio_stream_playmode(lVar6,0x101);
                  }
                  uVar7 = al_get_audio_stream_event_source(lVar6);
                  al_register_event_source(uVar5,uVar7);
                  cVar1 = al_attach_audio_stream_to_mixer(lVar6,lVar4);
                  if (cVar1 == '\0') {
                    log_printf("al_attach_audio_stream_to_mixer failed.\n");
                  }
                  else {
                    log_printf("Playing %s ... Waiting for stream to finish ",pcVar9);
                    do {
                      al_wait_for_event(uVar5,local_78);
                    } while (local_78[0] != 0x202);
                    log_printf("\n");
                    al_destroy_event_queue(uVar5);
                    al_destroy_audio_stream(lVar6);
                  }
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != (uint)argc);
            }
            log_printf("Done\n");
            al_destroy_mixer(lVar4);
            al_destroy_voice(lVar3);
            al_uninstall_audio();
            return 0;
          }
          pcVar9 = "al_attach_mixer_to_voice failed.\n";
        }
      }
    }
  }
  abort_example(pcVar9);
  iVar2 = __cxa_atexit();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   int i;
   ALLEGRO_VOICE*  voice;
   ALLEGRO_MIXER*  mixer;
   bool loop = false;
   int arg_start = 1;

   if (!al_init()) {
       abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\n");
      log_printf("Usage: %s [--loop] {audio_files}\n", argv[0]);
      goto done;
   }

   if (strcmp(argv[1], "--loop") == 0) {
      loop = true;
      arg_start = 2;
   }

   al_init_acodec_addon();

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   voice = al_create_voice(44100, ALLEGRO_AUDIO_DEPTH_INT16,
                           ALLEGRO_CHANNEL_CONF_2);
   if (!voice) {
      abort_example("Could not create ALLEGRO_VOICE.\n");
   }
   log_printf("Voice created.\n");

#ifndef BYPASS_MIXER
   mixer = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
                           ALLEGRO_CHANNEL_CONF_2);
   if (!mixer) {
      abort_example("Could not create ALLEGRO_MIXER.\n");
   }
   log_printf("Mixer created.\n");

   if (!al_attach_mixer_to_voice(mixer, voice)) {
      abort_example("al_attach_mixer_to_voice failed.\n");
   }
#endif

   for (i = arg_start; i < argc; ++i)
   {
      ALLEGRO_AUDIO_STREAM* stream;
      const char*     filename = argv[i];
      bool playing = true;
      ALLEGRO_EVENT event;
      ALLEGRO_EVENT_QUEUE* queue = al_create_event_queue();

      stream = al_load_audio_stream(filename, 4, 2048);
      if (!stream) {
         log_printf("Could not create an ALLEGRO_AUDIO_STREAM from '%s'!\n",
                 filename);
         continue;
      }
      log_printf("Stream created from '%s'.\n", filename);
      if (loop) {
         al_set_audio_stream_playmode(stream, loop ? ALLEGRO_PLAYMODE_LOOP : ALLEGRO_PLAYMODE_ONCE);
      }
      
      al_register_event_source(queue, al_get_audio_stream_event_source(stream));

#ifndef BYPASS_MIXER
      if (!al_attach_audio_stream_to_mixer(stream, mixer)) {
         log_printf("al_attach_audio_stream_to_mixer failed.\n");
         continue;
      }
#else
      if (!al_attach_audio_stream_to_voice(stream, voice)) {
         abort_example("al_attach_audio_stream_to_voice failed.\n");
      }
#endif

      log_printf("Playing %s ... Waiting for stream to finish ", filename);
      do {
         al_wait_for_event(queue, &event);
         if(event.type == ALLEGRO_EVENT_AUDIO_STREAM_FINISHED)
            playing = false;
      } while (playing);
      log_printf("\n");

      al_destroy_event_queue(queue);
      al_destroy_audio_stream(stream);
   }
   log_printf("Done\n");

#ifndef BYPASS_MIXER
   al_destroy_mixer(mixer);
#endif
   al_destroy_voice(voice);

   al_uninstall_audio();
done:
   close_log(true);

   return 0;
}